

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

bool __thiscall Lexer::isPath(Lexer *this,string *token,Type *type)

{
  size_t sVar1;
  char cVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  pointer pcVar6;
  uint uVar7;
  size_t marker;
  size_t local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (this->_enablePath == true) {
    local_58 = this->_cursor;
    pcVar6 = (this->_text)._M_dataplus._M_p;
    bVar5 = true;
    if (pcVar6[local_58] == '/') {
      uVar4 = 0;
      do {
        uVar7 = uVar4;
        sVar1 = local_58 + 1;
        lVar3 = local_58 + 1;
        local_58 = sVar1;
        if (((pcVar6[lVar3] == '\0') || (bVar5 = unicodeWhitespace((int)pcVar6[lVar3]), bVar5)) ||
           ((this->_text)._M_dataplus._M_p[local_58] == '/')) break;
        do {
          utf8_next_char(&this->_text,&local_58);
          cVar2 = (this->_text)._M_dataplus._M_p[local_58];
          if ((cVar2 == '\0') || (bVar5 = unicodeWhitespace((int)cVar2), bVar5)) break;
        } while ((this->_text)._M_dataplus._M_p[local_58] != '/');
        pcVar6 = (this->_text)._M_dataplus._M_p;
        uVar4 = uVar7 + 1;
      } while (pcVar6[local_58] == '/');
      bVar5 = uVar7 < 3;
    }
    bVar5 = (bool)(local_58 <= this->_cursor | bVar5);
    if (!bVar5) {
      *type = path;
      std::__cxx11::string::substr((ulong)local_50,(ulong)this);
      std::__cxx11::string::operator=((string *)token,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      this->_cursor = local_58;
      if (!bVar5) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Lexer::isPath (std::string& token, Lexer::Type& type)
{
  if (_enablePath)
  {
    std::size_t marker = _cursor;
    int slashCount = 0;

    while (1)
    {
      if (_text[marker] == '/')
      {
        ++marker;
        ++slashCount;
      }
      else
        break;

      if (_text[marker] &&
          ! unicodeWhitespace (_text[marker]) &&
          _text[marker] != '/')
      {
        utf8_next_char (_text, marker);
        while (_text[marker] &&
               ! unicodeWhitespace (_text[marker]) &&
               _text[marker] != '/')
          utf8_next_char (_text, marker);
      }
      else
        break;
    }

    if (marker > _cursor &&
        slashCount > 3)
    {
      type = Lexer::Type::path;
      token = _text.substr (_cursor, marker - _cursor);
      _cursor = marker;
      return true;
    }
  }

  return false;
}